

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O2

void __thiscall wasm::Fuzzer::checkLUBs(Fuzzer *this)

{
  ostream *poVar1;
  HeapType HVar2;
  HeapType HVar3;
  char cVar4;
  char cVar5;
  pointer pHVar6;
  HeapType HVar7;
  uintptr_t uVar8;
  pointer pHVar9;
  char extraout_DL;
  char extraout_DL_00;
  char extraout_DL_01;
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 local_1d0 [392];
  HeapType local_48;
  ulong local_40;
  ulong local_38;
  
  pHVar6 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_start;
  pHVar9 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_38 = 0;
  do {
    local_40 = local_38;
    if ((ulong)((long)pHVar9 - (long)pHVar6 >> 3) <= local_38) {
      return;
    }
    for (; local_38 < (ulong)((long)pHVar9 - (long)pHVar6 >> 3); local_38 = local_38 + 1) {
      HVar2.id = pHVar6[local_40].id;
      HVar3.id = pHVar6[local_38].id;
      auVar10 = wasm::HeapType::getLeastUpperBound(HVar2,HVar3);
      HVar7.id = auVar10._0_8_;
      local_48.id = HVar3.id;
      auVar11 = wasm::HeapType::getLeastUpperBound(HVar3,HVar2);
      HVar3.id = local_48.id;
      cVar5 = auVar10[8];
      if ((auVar10 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
        if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          Fatal::Fatal((Fatal *)local_1d0);
          poVar1 = (ostream *)(local_1d0 + 0x10);
          std::operator<<(poVar1,"There is no LUB of HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," and HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,", but there is a LUB in the reverse direction!\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,HVar2);
          std::operator<<(poVar1,"\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,local_48);
          std::operator<<(poVar1,"\n");
          std::operator<<(poVar1,"lub: ");
          wasm::operator<<(poVar1,(HeapType)auVar11._0_8_);
          Fatal::operator<<((Fatal *)local_1d0,(char (*) [2])0x19daab);
LAB_0019189b:
          Fatal::~Fatal((Fatal *)local_1d0);
        }
        cVar5 = wasm::HeapType::isSubType(HVar2,local_48);
        if (cVar5 != '\0') {
          Fatal::Fatal((Fatal *)local_1d0);
          poVar1 = (ostream *)(local_1d0 + 0x10);
          std::operator<<(poVar1,"There is no LUB of HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," and HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,", but HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," is a subtype of HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,"!\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,HVar2);
          std::operator<<(poVar1,"\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,local_48);
          Fatal::operator<<((Fatal *)local_1d0,(char (*) [2])0x19daab);
          goto LAB_0019189b;
        }
        cVar5 = wasm::HeapType::isSubType(HVar3,HVar2);
        if (cVar5 != '\0') {
          Fatal::Fatal((Fatal *)local_1d0);
          poVar1 = (ostream *)(local_1d0 + 0x10);
          std::operator<<(poVar1,"There is no LUB of HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," and HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,", but HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," is a subtype of HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,"!\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,HVar2);
          std::operator<<(poVar1,"\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,local_48);
          Fatal::operator<<((Fatal *)local_1d0,(char (*) [2])0x19daab);
          goto LAB_0019189b;
        }
      }
      else {
        if ((((cVar5 != auVar11[8]) || (HVar7.id != auVar11._0_8_)) ||
            (uVar8 = wasm::HeapType::getLeastUpperBound(HVar2,local_48), cVar5 != extraout_DL)) ||
           (HVar7.id != uVar8)) {
          Fatal::Fatal((Fatal *)local_1d0);
          poVar1 = (ostream *)(local_1d0 + 0x10);
          std::operator<<(poVar1,"Could not calculate a stable LUB of HeapTypes ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," and ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,"!\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,HVar2);
          std::operator<<(poVar1,"\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,local_48);
          Fatal::operator<<((Fatal *)local_1d0,(char (*) [2])0x19daab);
          goto LAB_0019189b;
        }
        cVar4 = wasm::HeapType::isSubType(HVar2,HVar7);
        HVar3.id = local_48.id;
        if (cVar4 == '\0') {
          Fatal::Fatal((Fatal *)local_1d0);
          poVar1 = (ostream *)(local_1d0 + 0x10);
          std::operator<<(poVar1,"HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," is not a subtype of its LUB with HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,"!\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,HVar2);
          std::operator<<(poVar1,"\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,local_48);
          std::operator<<(poVar1,"\n");
          std::operator<<(poVar1,"lub: ");
          wasm::operator<<(poVar1,HVar7);
          Fatal::operator<<((Fatal *)local_1d0,(char (*) [2])0x19daab);
          goto LAB_0019189b;
        }
        cVar4 = wasm::HeapType::isSubType(local_48,HVar7);
        if (cVar4 == '\0') {
          Fatal::Fatal((Fatal *)local_1d0);
          poVar1 = (ostream *)(local_1d0 + 0x10);
          std::operator<<(poVar1,"HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," is not a subtype of its LUB with HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,"!\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,HVar2);
          std::operator<<(poVar1,"\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,local_48);
          std::operator<<(poVar1,"\n");
          std::operator<<(poVar1,"lub: ");
          wasm::operator<<(poVar1,HVar7);
          Fatal::operator<<((Fatal *)local_1d0,(char (*) [2])0x19daab);
          goto LAB_0019189b;
        }
        uVar8 = wasm::HeapType::getLeastUpperBound(HVar2,HVar7);
        if ((cVar5 != extraout_DL_00) || (HVar7.id != uVar8)) {
          Fatal::Fatal((Fatal *)local_1d0);
          poVar1 = (ostream *)(local_1d0 + 0x10);
          std::operator<<(poVar1,"The LUB of HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," and HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," should be the LUB of itself and HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,", but it is not!\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,HVar2);
          std::operator<<(poVar1,"\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,local_48);
          std::operator<<(poVar1,"\n");
          std::operator<<(poVar1,"lub: ");
          wasm::operator<<(poVar1,HVar7);
          Fatal::operator<<((Fatal *)local_1d0,(char (*) [2])0x19daab);
          goto LAB_0019189b;
        }
        uVar8 = wasm::HeapType::getLeastUpperBound(HVar7,HVar3);
        if ((cVar5 != extraout_DL_01) || (HVar7.id != uVar8)) {
          Fatal::Fatal((Fatal *)local_1d0);
          poVar1 = (ostream *)(local_1d0 + 0x10);
          std::operator<<(poVar1,"The LUB of HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," and HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1," should be the LUB of itself and HeapType ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,", but it is not!\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,HVar2);
          std::operator<<(poVar1,"\n");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(poVar1,": ");
          wasm::operator<<(poVar1,local_48);
          std::operator<<(poVar1,"\n");
          std::operator<<(poVar1,"lub: ");
          wasm::operator<<(poVar1,HVar7);
          Fatal::operator<<((Fatal *)local_1d0,(char (*) [2])0x19daab);
          goto LAB_0019189b;
        }
      }
      pHVar6 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pHVar9 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    local_38 = local_40 + 1;
  } while( true );
}

Assistant:

void Fuzzer::checkLUBs() const {
  // For each unordered pair of types...
  for (size_t i = 0; i < types.size(); ++i) {
    for (size_t j = i; j < types.size(); ++j) {
      HeapType a = types[i], b = types[j];
      // Check that their LUB is stable when calculated multiple times and in
      // reverse order.
      auto lub = HeapType::getLeastUpperBound(a, b);
      if (lub) {
        if (lub != HeapType::getLeastUpperBound(b, a) ||
            lub != HeapType::getLeastUpperBound(a, b)) {
          Fatal() << "Could not calculate a stable LUB of HeapTypes " << i
                  << " and " << j << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n";
        }
        // Check that each type is a subtype of the LUB.
        if (!HeapType::isSubType(a, *lub)) {
          Fatal() << "HeapType " << i
                  << " is not a subtype of its LUB with HeapType " << j << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
        if (!HeapType::isSubType(b, *lub)) {
          Fatal() << "HeapType " << j
                  << " is not a subtype of its LUB with HeapType " << i << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
        // Check that the LUB of each type and the original LUB is still the
        // original LUB.
        if (lub != HeapType::getLeastUpperBound(a, *lub)) {
          Fatal() << "The LUB of HeapType " << i << " and HeapType " << j
                  << " should be the LUB of itself and HeapType " << i
                  << ", but it is not!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
        if (lub != HeapType::getLeastUpperBound(*lub, b)) {
          Fatal() << "The LUB of HeapType " << i << " and HeapType " << j
                  << " should be the LUB of itself and HeapType " << j
                  << ", but it is not!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
      } else {
        // No LUB. Check that this is symmetrical.
        if (auto lub2 = HeapType::getLeastUpperBound(b, a)) {
          Fatal() << "There is no LUB of HeapType " << i << " and HeapType "
                  << j << ", but there is a LUB in the reverse direction!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub2 << "\n";
        }
        // There also shouldn't be a subtype relation in this case.
        if (HeapType::isSubType(a, b)) {
          Fatal() << "There is no LUB of HeapType " << i << " and HeapType "
                  << j << ", but HeapType " << i << " is a subtype of HeapType "
                  << j << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n";
        }
        if (HeapType::isSubType(b, a)) {
          Fatal() << "There is no LUB of HeapType " << i << " and HeapType "
                  << j << ", but HeapType " << j << " is a subtype of HeapType "
                  << i << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n";
        }
      }
    }
  }
}